

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

string * __thiscall
gl3cts::InvalidUseCasesForAllNotFuncsAndExclMarkOpTest::getIterationName_abi_cxx11_
          (string *__return_storage_ptr__,InvalidUseCasesForAllNotFuncsAndExclMarkOpTest *this,
          _test_iteration iteration)

{
  TestError *this_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (iteration < TEST_ITERATION_COUNT) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized test iteration type.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
             ,0x439);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string InvalidUseCasesForAllNotFuncsAndExclMarkOpTest::getIterationName(_test_iteration iteration) const
{
	std::string result;

	switch (iteration)
	{
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC2:
		result = "! operator must not accept bvec2 arg";
		break;
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC3:
		result = "! operator must not accept bvec3 arg";
		break;
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC4:
		result = "! operator must not accept bvec4 arg";
		break;
	case TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL:
		result = "all() function must not accept bool arg";
		break;
	case TEST_ITERATION_NOT_FUNC_MUST_NOT_ACCEPT_BOOL:
		result = "not() function must not accept bool arg";
		break;
	default:
	{
		TCU_FAIL("Unrecognized test iteration type.");
	}
	} /* switch (iteration) */

	return result;
}